

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O2

bool libtorrent::anon_unknown_1::extract_files2
               (bdecode_node *tree,file_storage *target,string *root_dir,ptrdiff_t info_offset,
               char *info_buffer,bool has_files,int depth,error_code *ec)

{
  string_view symlink_path_00;
  file_flags_t file_flags;
  bool bVar1;
  type_t tVar2;
  int iVar3;
  ptrdiff_t pVar4;
  int64_t mtime;
  char *pcVar5;
  error_code *peVar6;
  int i;
  string *path_00;
  error_code_enum val;
  char *pcVar7;
  int i_00;
  bool bVar8;
  string_view key;
  string_view key_00;
  string_view sVar9;
  basic_string_view<char,_std::char_traits<char>_> __y;
  string_view key_01;
  string_view element;
  string_view key_02;
  string_view filename;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  ulong local_218;
  string path;
  string symlink_path;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_libtorrent::bdecode_node> local_190;
  size_type local_140;
  pointer pcStack_138;
  bdecode_node s_p;
  pair<libtorrent::bdecode_node,_libtorrent::bdecode_node> e;
  bdecode_node local_70;
  
  pcVar5 = (char *)info_offset;
  tVar2 = bdecode_node::type(tree);
  if ((tVar2 == dict_t) && (depth < 0x65)) {
    i_00 = 0;
    while( true ) {
      iVar3 = bdecode_node::dict_size(tree);
      if (iVar3 <= i_00) break;
      bdecode_node::dict_at_node(&e,tree,i_00);
      tVar2 = bdecode_node::type(&e.second);
      if (tVar2 != dict_t) {
LAB_0031c656:
        boost::system::error_code::operator=(ec,torrent_file_parse_failed);
LAB_0031c6c1:
        ::std::pair<libtorrent::bdecode_node,_libtorrent::bdecode_node>::~pair(&e);
        goto LAB_0031c6ce;
      }
      sVar9 = bdecode_node::string_value(&e.first);
      if (sVar9._M_len == 0) goto LAB_0031c656;
      pVar4 = bdecode_node::string_offset(&e.first);
      iVar3 = bdecode_node::string_length(&e.first);
      path_00 = (string *)(long)iVar3;
      for (pcVar7 = info_buffer + (pVar4 - info_offset);
          (path_00 != (string *)0x0 && (*pcVar7 == '/')); pcVar7 = pcVar7 + 1) {
        path_00 = (string *)((long)&path_00[-1].field_2 + 0xf);
      }
      iVar3 = bdecode_node::dict_size(&e.second);
      if (iVar3 == 1) {
        bdecode_node::dict_at(&local_190,&e.second,0);
        bVar8 = (char *)local_190.first._M_len == (char *)0x0;
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&local_190.second);
        if ((!bVar8 || has_files) || (iVar3 = bdecode_node::dict_size(tree), iVar3 != 1))
        goto LAB_0031c25d;
        path._M_dataplus._M_p = (pointer)&path.field_2;
        path._M_string_length = 0;
        path.field_2._M_local_buf[0] = '\0';
      }
      else {
        bVar8 = false;
LAB_0031c25d:
        ::std::__cxx11::string::string((string *)&path,(string *)root_dir);
      }
      sVar9._M_str = pcVar5;
      sVar9._M_len = (size_t)pcVar7;
      aux::sanitize_append_path_element((aux *)&path,path_00,sVar9);
      if (bVar8) {
        if (path._M_string_length < path_00) {
LAB_0031c2d3:
          pcVar5 = (char *)0x0;
          path_00 = (string *)0x0;
        }
        else {
          ::std::__cxx11::string::substr((ulong)&local_190,(ulong)&path);
          __y._M_str = pcVar7;
          __y._M_len = (size_t)path_00;
          __x._M_str = (char *)local_190.first._M_len;
          __x._M_len = (size_t)local_190.first._M_str;
          bVar8 = ::std::operator!=(__x,__y);
          ::std::__cxx11::string::~string((string *)&local_190);
          pcVar5 = pcVar7;
          if (bVar8) goto LAB_0031c2d3;
        }
        bdecode_node::dict_at(&local_190,&e.second,0);
        tVar2 = bdecode_node::type(&local_190.second);
        if (tVar2 == dict_t) {
          file_flags = get_file_attributes(&local_190.second);
          if ((file_flags.m_val & 1) == 0) {
            if ((file_flags.m_val & 8) == 0) {
              key._M_str = "length";
              key._M_len = 6;
              local_218 = bdecode_node::dict_find_int_value(&local_190.second,key,-1);
              if (0x3ffffffe < local_218 >> 0xe) {
                val = torrent_invalid_length;
                goto LAB_0031c676;
              }
            }
            else {
              local_218 = 0;
            }
            key_00._M_str = "mtime";
            key_00._M_len = 5;
            mtime = bdecode_node::dict_find_int_value(&local_190.second,key_00,0);
            symlink_path._M_string_length = 0;
            symlink_path._M_dataplus._M_p = (pointer)&symlink_path.field_2;
            symlink_path.field_2._M_local_buf[0] = '\0';
            if ((file_flags.m_val & 8) == 0) {
LAB_0031c4dc:
              if (local_218 == 0 || symlink_path._M_string_length != 0) {
                pcVar7 = (char *)0x0;
              }
              else {
                key_02._M_str = "pieces root";
                key_02._M_len = 0xb;
                bdecode_node::dict_find_string(&s_p,&local_190.second,key_02);
                bVar8 = bdecode_node::operator_cast_to_bool(&s_p);
                if (((bVar8) && (tVar2 = bdecode_node::type(&s_p), tVar2 == string_t)) &&
                   (iVar3 = bdecode_node::string_length(&s_p), iVar3 == 0x20)) {
                  pVar4 = bdecode_node::string_offset(&s_p);
                  pcVar7 = info_buffer + (pVar4 - info_offset);
                  digest32<256L>::digest32((digest32<256L> *)&local_70,pcVar7);
                  bVar1 = digest32<256L>::is_all_zeros((digest32<256L> *)&local_70);
                  bVar8 = true;
                  if (bVar1) goto LAB_0031c56c;
                }
                else {
                  pcVar7 = (char *)0x0;
LAB_0031c56c:
                  boost::system::error_code::operator=(ec,torrent_missing_pieces_root);
                  bVar8 = false;
                }
                ::std::
                _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                 *)&s_p);
                if (!bVar8) goto LAB_0031c69d;
              }
              pcStack_138 = symlink_path._M_dataplus._M_p;
              symlink_path_00._M_str = symlink_path._M_dataplus._M_p;
              symlink_path_00._M_len = symlink_path._M_string_length;
              filename._M_str = pcVar5;
              filename._M_len = (size_t)path_00;
              local_140 = symlink_path._M_string_length;
              file_storage::add_file_borrow
                        (target,ec,filename,&path,local_218,file_flags,mtime,symlink_path_00,pcVar7)
              ;
              bVar8 = ec->failed_;
              ::std::__cxx11::string::~string((string *)&symlink_path);
              ::std::
              _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                               *)&local_190.second);
              if (bVar8 != false) goto LAB_0031c6b7;
              goto LAB_0031c631;
            }
            key_01._M_str = "symlink path";
            key_01._M_len = 0xc;
            bdecode_node::dict_find_list(&s_p,&local_190.second,key_01);
            bVar8 = bdecode_node::operator_cast_to_bool(&s_p);
            if (!bVar8) {
LAB_0031c4c4:
              ::std::
              _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                               *)&s_p);
              goto LAB_0031c4dc;
            }
            path_length(&s_p,ec);
            if (ec->failed_ == false) {
              peVar6 = ec;
              ::std::__cxx11::string::reserve((ulong)&symlink_path);
              iVar3 = bdecode_node::list_size(&s_p);
              i = 0;
              if (iVar3 < 1) {
                iVar3 = i;
              }
              for (; iVar3 != i; i = i + 1) {
                bdecode_node::list_at(&local_70,&s_p,i);
                sVar9 = bdecode_node::string_value(&local_70);
                element._M_len = sVar9._M_str;
                ::std::
                _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                 *)&local_70);
                element._M_str = (char *)peVar6;
                aux::sanitize_append_path_element
                          ((aux *)&symlink_path,(string *)sVar9._M_len,element);
              }
              goto LAB_0031c4c4;
            }
            ::std::
            _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                             *)&s_p);
LAB_0031c69d:
            ::std::__cxx11::string::~string((string *)&symlink_path);
          }
          else {
            val = torrent_invalid_pad_file;
LAB_0031c676:
            boost::system::error_code::operator=(ec,val);
          }
        }
        ::std::
        _Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ::~_Vector_base((_Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                         *)&local_190.second);
LAB_0031c6b7:
        ::std::__cxx11::string::~string((string *)&path);
        goto LAB_0031c6c1;
      }
      pcVar5 = (char *)info_offset;
      bVar8 = extract_files2(&e.second,target,&path,info_offset,info_buffer,true,depth + 1,ec);
      if (!bVar8) goto LAB_0031c6b7;
LAB_0031c631:
      ::std::__cxx11::string::~string((string *)&path);
      ::std::pair<libtorrent::bdecode_node,_libtorrent::bdecode_node>::~pair(&e);
      i_00 = i_00 + 1;
    }
    bVar8 = true;
  }
  else {
    boost::system::error_code::operator=(ec,torrent_file_parse_failed);
LAB_0031c6ce:
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool extract_files2(bdecode_node const& tree, file_storage& target
		, std::string const& root_dir, ptrdiff_t const info_offset
		, char const* info_buffer
		, bool const has_files, int const depth, error_code& ec)
	{
		if (tree.type() != bdecode_node::dict_t)
		{
			ec = errors::torrent_file_parse_failed;
			return false;
		}

		// since we're parsing this recursively, we have to be careful not to blow
		// up the stack. 100 levels of sub directories should be enough. This
		// could be improved by an iterative parser, keeping the state on a more
		// compact side-stack
		if (depth > 100)
		{
			ec = errors::torrent_file_parse_failed;
			return false;
		}

		for (int i = 0; i < tree.dict_size(); ++i)
		{
			auto e = tree.dict_at_node(i);
			if (e.second.type() != bdecode_node::dict_t || e.first.string_value().empty())
			{
				ec = errors::torrent_file_parse_failed;
				return false;
			}

			string_view filename = { info_buffer + (e.first.string_offset() - info_offset)
				, static_cast<size_t>(e.first.string_length()) };
			while (!filename.empty() && filename.front() == TORRENT_SEPARATOR)
				filename.remove_prefix(1);

			bool const leaf_node = e.second.dict_size() == 1 && e.second.dict_at(0).first.empty();
			bool const single_file = leaf_node && !has_files && tree.dict_size() == 1;

			std::string path = single_file ? std::string() : root_dir;
			aux::sanitize_append_path_element(path, filename);

			if (leaf_node)
			{
				if (filename.size() > path.length()
					|| path.substr(path.size() - filename.size()) != filename)
				{
					// if the filename was sanitized and differ, clear it to just use path
					filename = {};
				}

				if (!extract_single_file2(e.second.dict_at(0).second, target
					, path, filename, info_offset, info_buffer, ec))
				{
					return false;
				}
				continue;
			}

			if (!extract_files2(e.second, target, path, info_offset, info_buffer
				, true, depth + 1, ec))
			{
				return false;
			}
		}

		return true;
	}